

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_pad2.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  int k;
  
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x180);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int k = -9384;

    cout << -k % 1000 << endl;
}